

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

ostream * operator<<(ostream *os,v_array<char> *v)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(os,'[');
  for (pcVar2 = v->_begin; pcVar2 != v->_end; pcVar2 = pcVar2 + 1) {
    poVar1 = std::operator<<(os,' ');
    std::operator<<(poVar1,*pcVar2);
  }
  std::operator<<(os," ]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<T>& v)
{
  os << '[';
  for (T* i = v._begin; i != v._end; ++i) os << ' ' << *i;
  os << " ]";
  return os;
}